

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O0

CServerFilter * __thiscall
CServerBrowserFilter::CServerFilter::operator=(CServerFilter *this,CServerFilter *Other)

{
  int *piVar1;
  CServerFilter *in_RSI;
  CServerFilter *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar2;
  
  if (in_RSI != in_RDI) {
    in_RDI->m_pServerBrowserFilter = in_RSI->m_pServerBrowserFilter;
    CServerFilterInfo::Set
              ((CServerFilterInfo *)in_RSI,
               (CServerFilterInfo *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    in_RDI->m_NumSortedPlayers = in_RSI->m_NumSortedPlayers;
    in_RDI->m_NumSortedServers = in_RSI->m_NumSortedServers;
    in_RDI->m_SortedServersCapacity = in_RSI->m_SortedServersCapacity;
    if (in_RDI->m_pSortedServerlist != (int *)0x0) {
      mem_free((void *)0x138efc);
    }
    piVar1 = (int *)mem_alloc(0);
    in_RDI->m_pSortedServerlist = piVar1;
    for (iVar2 = 0; iVar2 < in_RDI->m_SortedServersCapacity; iVar2 = iVar2 + 1) {
      in_RDI->m_pSortedServerlist[iVar2] = in_RSI->m_pSortedServerlist[iVar2];
    }
  }
  return in_RDI;
}

Assistant:

CServerBrowserFilter::CServerFilter& CServerBrowserFilter::CServerFilter::operator=(const CServerBrowserFilter::CServerFilter& Other)
{
	if(&Other != this)
	{
		m_pServerBrowserFilter = Other.m_pServerBrowserFilter;
		m_FilterInfo.Set(&Other.m_FilterInfo);
		m_NumSortedPlayers = Other.m_NumSortedPlayers;
		m_NumSortedServers = Other.m_NumSortedServers;
		m_SortedServersCapacity = Other.m_SortedServersCapacity;

		if(m_pSortedServerlist)
			mem_free(m_pSortedServerlist);
		m_pSortedServerlist = (int *)mem_alloc(m_SortedServersCapacity * sizeof(int));
		for(int i = 0; i < m_SortedServersCapacity; ++i)
			m_pSortedServerlist[i] = Other.m_pSortedServerlist[i];
	}
	return *this;
}